

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  ulong uVar1;
  bool bVar2;
  reference ppTVar3;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar4;
  size_type sVar5;
  reference ppTVar6;
  char *pcVar7;
  FILE *pFVar8;
  undefined8 uVar9;
  long in_RDI;
  stringstream stream;
  FILE *fileout;
  string *output_format;
  TestInfo *test_info;
  size_t j;
  bool printed_test_suite_name;
  TestSuite *test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int kMaxParamLength;
  TestInfo *in_stack_fffffffffffffc88;
  string *this_00;
  JsonUnitTestResultPrinter *in_stack_fffffffffffffc90;
  allocator *output_file;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  stringstream *in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd10;
  string local_2e8 [72];
  string local_2a0 [72];
  stringstream local_258 [48];
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *in_stack_fffffffffffffdd8;
  ostream *in_stack_fffffffffffffde0;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  FILE *local_88;
  string local_70 [32];
  string *local_50;
  value_type local_48;
  ulong local_40;
  byte local_31;
  TestSuite *local_30;
  TestSuite **local_28;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_20;
  long local_18;
  undefined4 local_c;
  
  local_c = 0xfa;
  local_18 = in_RDI + 0xb8;
  local_20._M_current =
       (TestSuite **)
       std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                 ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                  in_stack_fffffffffffffc88);
  local_28 = (TestSuite **)
             std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                       ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                        in_stack_fffffffffffffc88);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                             *)in_stack_fffffffffffffc90,
                            (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                             *)in_stack_fffffffffffffc88), bVar2) {
    ppTVar3 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&local_20);
    local_30 = *ppTVar3;
    local_31 = 0;
    local_40 = 0;
    while( true ) {
      uVar1 = local_40;
      pvVar4 = TestSuite::test_info_list(local_30);
      sVar5 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar4);
      if (sVar5 <= uVar1) break;
      pvVar4 = TestSuite::test_info_list(local_30);
      ppTVar6 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar4,local_40);
      local_48 = *ppTVar6;
      if ((local_48->matches_filter_ & 1U) != 0) {
        if ((local_31 & 1) == 0) {
          local_31 = 1;
          pcVar7 = TestSuite::name((TestSuite *)0x144cb8);
          printf("%s.",pcVar7);
          pcVar7 = TestSuite::type_param((TestSuite *)in_stack_fffffffffffffc88);
          if (pcVar7 != (char *)0x0) {
            printf("  # %s = ","TypeParam");
            TestSuite::type_param((TestSuite *)in_stack_fffffffffffffc88);
            PrintOnOneLine((char *)in_stack_fffffffffffffc90,
                           (int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
          }
          printf("\n");
        }
        pcVar7 = TestInfo::name((TestInfo *)0x144d26);
        printf("  %s",pcVar7);
        pcVar7 = TestInfo::value_param(in_stack_fffffffffffffc88);
        if (pcVar7 != (char *)0x0) {
          printf("  # %s = ","GetParam()");
          TestInfo::value_param(in_stack_fffffffffffffc88);
          PrintOnOneLine((char *)in_stack_fffffffffffffc90,
                         (int)((ulong)in_stack_fffffffffffffc88 >> 0x20));
        }
        printf("\n");
      }
      local_40 = local_40 + 1;
    }
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&local_20);
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  local_50 = local_70;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
  if ((bVar2) ||
     (in_stack_fffffffffffffcd7 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88),
     (bool)in_stack_fffffffffffffcd7)) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    output_file = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar7,output_file);
    pFVar8 = (FILE *)OpenFileForWriting(in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_c8);
    local_88 = pFVar8;
    std::__cxx11::stringstream::stringstream(local_258);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
    if (bVar2) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      std::__cxx11::string::c_str();
      XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
                ((XmlUnitTestResultPrinter *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),(char *)output_file);
      XmlUnitTestResultPrinter::PrintXmlTestsList
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      XmlUnitTestResultPrinter::~XmlUnitTestResultPrinter
                ((XmlUnitTestResultPrinter *)in_stack_fffffffffffffc90);
      std::__cxx11::string::~string(local_2a0);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
      if (bVar2) {
        UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
        std::__cxx11::string::c_str();
        JsonUnitTestResultPrinter::JsonUnitTestResultPrinter
                  ((JsonUnitTestResultPrinter *)
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),(char *)output_file
                  );
        JsonUnitTestResultPrinter::PrintJsonTestList
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        JsonUnitTestResultPrinter::~JsonUnitTestResultPrinter(in_stack_fffffffffffffc90);
        std::__cxx11::string::~string(local_2e8);
      }
    }
    pFVar8 = local_88;
    StringStreamToString(in_stack_fffffffffffffcf8);
    this_00 = (string *)&stack0xfffffffffffffcf8;
    uVar9 = std::__cxx11::string::c_str();
    fprintf(pFVar8,"%s",uVar9);
    std::__cxx11::string::~string(this_00);
    fclose(local_88);
    std::__cxx11::stringstream::~stringstream(local_258);
  }
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (auto* test_suite : test_suites_) {
    bool printed_test_suite_name = false;

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      const TestInfo* const test_info = test_suite->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_suite_name) {
          printed_test_suite_name = true;
          printf("%s.", test_suite->name());
          if (test_suite->type_param() != nullptr) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_suite->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != nullptr) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml" || output_format == "json") {
    FILE* fileout = OpenFileForWriting(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str());
    std::stringstream stream;
    if (output_format == "xml") {
      XmlUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintXmlTestsList(&stream, test_suites_);
    } else if (output_format == "json") {
      JsonUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintJsonTestList(&stream, test_suites_);
    }
    fprintf(fileout, "%s", StringStreamToString(&stream).c_str());
    fclose(fileout);
  }
}